

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_indexer_impl.h
# Opt level: O1

void node::fav_child_processing_order<node::TreeIndexAll>
               (TreeIndexAll *ti,int *postorder,int *favorder)

{
  int iVar1;
  int iVar2;
  pointer pvVar3;
  bool bVar4;
  long lVar5;
  pointer piVar6;
  ulong uVar7;
  ulong uVar8;
  
  iVar1 = *postorder;
  pvVar3 = (ti->super_PostLToChildren).postl_to_children_.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (*(pointer *)((long)&pvVar3[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl + 8)
      != *(pointer *)&pvVar3[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl) {
    fav_child_processing_order<node::TreeIndexAll>
              (ti,(ti->super_PostLToFavChild).postl_to_fav_child_.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + iVar1,favorder);
    lVar5 = (long)*postorder;
    pvVar3 = (ti->super_PostLToChildren).postl_to_children_.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar6 = *(pointer *)&pvVar3[lVar5].super__Vector_base<int,_std::allocator<int>_>._M_impl;
    if (*(pointer *)((long)&pvVar3[lVar5].super__Vector_base<int,_std::allocator<int>_>._M_impl + 8)
        != piVar6) {
      uVar7 = 0;
      uVar8 = 1;
      do {
        if (piVar6[uVar7] !=
            (ti->super_PostLToFavChild).postl_to_fav_child_.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [lVar5]) {
          fav_child_processing_order<node::TreeIndexAll>(ti,piVar6 + uVar7,favorder);
        }
        lVar5 = (long)*postorder;
        pvVar3 = (ti->super_PostLToChildren).postl_to_children_.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        piVar6 = *(pointer *)&pvVar3[lVar5].super__Vector_base<int,_std::allocator<int>_>._M_impl;
        bVar4 = uVar8 < (ulong)((long)*(pointer *)
                                       ((long)&pvVar3[lVar5].
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                       + 8) - (long)piVar6 >> 2);
        uVar7 = uVar8;
        uVar8 = (ulong)((int)uVar8 + 1);
      } while (bVar4);
    }
  }
  iVar1 = *postorder;
  iVar2 = *favorder;
  *favorder = iVar2 + 1;
  (ti->super_PostLToFavorableChildOrder).postl_to_favorder_.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[iVar2] =
       iVar1;
  return;
}

Assistant:

void fav_child_processing_order(TreeIndex& ti, int& postorder, int& favorder) {
  // Perform recursively for children.
  if (ti.postl_to_children_[postorder].size() != 0) {
    // First process the favorable child.
    fav_child_processing_order(ti, ti.postl_to_fav_child_[postorder], favorder);
    // Next, process all other children.
    for (unsigned int t = 0; t < ti.postl_to_children_[postorder].size(); ++t) {
      // Favorable child was processed before.
      if (ti.postl_to_children_[postorder][t] == ti.postl_to_fav_child_[postorder]) {
        continue;
      }
      // Process other children in left to right order.
      fav_child_processing_order(ti, ti.postl_to_children_[postorder][t], favorder);
    }
  }
  // Assign favorder to postorder.
  ti.postl_to_favorder_[favorder++] = postorder;
}